

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O1

int secp256k1_musig_aggnonce_load
              (secp256k1_context *ctx,secp256k1_ge *ges,secp256k1_musig_aggnonce *nonce)

{
  long lVar1;
  int iVar2;
  uchar *p1;
  
  lVar1 = 0;
  do {
    iVar2 = (uint)nonce->data[lVar1] - (uint)secp256k1_musig_aggnonce_magic[lVar1];
    if (nonce->data[lVar1] != secp256k1_musig_aggnonce_magic[lVar1]) goto LAB_00112028;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  iVar2 = 0;
LAB_00112028:
  if (iVar2 == 0) {
    lVar1 = 0;
    do {
      secp256k1_ge_from_bytes_ext(ges,nonce->data + lVar1 + 4);
      lVar1 = lVar1 + 0x40;
      ges = ges + 1;
    } while (lVar1 == 0x40);
    iVar2 = 1;
  }
  else {
    secp256k1_musig_aggnonce_load_cold_1();
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int secp256k1_musig_aggnonce_load(const secp256k1_context* ctx, secp256k1_ge* ges, const secp256k1_musig_aggnonce* nonce) {
    int i;

    ARG_CHECK(secp256k1_memcmp_var(&nonce->data[0], secp256k1_musig_aggnonce_magic, 4) == 0);
    for (i = 0; i < 2; i++) {
        secp256k1_ge_from_bytes_ext(&ges[i], &nonce->data[4 + 64*i]);
    }
    return 1;
}